

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
ObjectInObject_LoadObjectInObject_Test::~ObjectInObject_LoadObjectInObject_Test
          (ObjectInObject_LoadObjectInObject_Test *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00174948;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr(&(this->super_Test).gtest_flag_saver_);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectInObject, LoadObjectInObject) {
	obj_var2 v;
	const char* json_str = "{\n"
						   "	\"val1\": 1,\n"
						   "	\"val2\": 1.1,\n"
						   "	\"val3\": {\n"
						   "		\"val1\": 1,\n"
						   "		\"val2\": 1.1\n"
						   "	}\n"
						   "}\n";
	EXPECT_TRUE(JSON_OK == load_object_from_string(json_str, v));
	EXPECT_TRUE(v.val1 == 1);
	EXPECT_TRUE(v.val2 == 1.1f);
	EXPECT_TRUE(v.val3.val1 == 1);
	EXPECT_TRUE(v.val3.val2 == 1.1f);
}